

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

bool S_GetSoundPlayingInfo(sector_t *sec,int sound_id)

{
  FSoundChan *pFVar1;
  bool bVar2;
  FSoundChan **ppFVar3;
  
  if (sound_id < 1) {
    bVar2 = false;
  }
  else {
    ppFVar3 = &Channels;
    while( true ) {
      pFVar1 = *ppFVar3;
      bVar2 = pFVar1 != (FSoundChan *)0x0;
      if ((pFVar1 == (FSoundChan *)0x0) ||
         ((((pFVar1->OrgID).ID == sound_id && (pFVar1->SourceType == '\x02')) &&
          ((pFVar1->field_12).Actor == (AActor *)sec)))) break;
      ppFVar3 = &pFVar1->NextChan;
    }
  }
  return bVar2;
}

Assistant:

bool S_GetSoundPlayingInfo (const sector_t *sec, int sound_id)
{
	if (sound_id > 0)
	{
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			if (chan->OrgID == sound_id &&
				chan->SourceType == SOURCE_Sector &&
				chan->Sector == sec)
			{
				return true;
			}
		}
	}
	return false;
}